

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O2

int asn1_bit_string_length(ASN1_BIT_STRING *str,uint8_t *out_padding_bits)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = str->length;
  if ((str->flags & 8U) == 0) {
    uVar3 = (int)uVar1 >> 0x1f & uVar1;
    for (; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
      if (str->data[(ulong)uVar1 - 1] != 0) {
        uVar2 = 0;
        goto LAB_001f2292;
      }
    }
    uVar2 = 0;
    uVar1 = uVar3;
  }
  else {
    uVar2 = (uint)((byte)str->flags & 7);
    if (uVar1 == 0) {
      uVar2 = 0;
    }
  }
LAB_001f22a3:
  *out_padding_bits = (uint8_t)uVar2;
  return uVar1;
LAB_001f2292:
  if (uVar2 == 7) goto LAB_001f22a1;
  if ((str->data[(ulong)uVar1 - 1] >> (uVar2 & 0x1f) & 1) != 0) goto LAB_001f22a3;
  uVar2 = uVar2 + 1;
  goto LAB_001f2292;
LAB_001f22a1:
  uVar2 = 7;
  goto LAB_001f22a3;
}

Assistant:

int asn1_bit_string_length(const ASN1_BIT_STRING *str,
                           uint8_t *out_padding_bits) {
  int len = str->length;
  if (str->flags & ASN1_STRING_FLAG_BITS_LEFT) {
    // If the string is already empty, it cannot have padding bits.
    *out_padding_bits = len == 0 ? 0 : str->flags & 0x07;
    return len;
  }

  // TODO(https://crbug.com/boringssl/447): If we move this logic to
  // |ASN1_BIT_STRING_set_bit|, can we remove this representation?
  while (len > 0 && str->data[len - 1] == 0) {
    len--;
  }
  uint8_t padding_bits = 0;
  if (len > 0) {
    uint8_t last = str->data[len - 1];
    assert(last != 0);
    for (; padding_bits < 7; padding_bits++) {
      if (last & (1 << padding_bits)) {
        break;
      }
    }
  }
  *out_padding_bits = padding_bits;
  return len;
}